

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

void __thiscall gvr::PLYReader::~PLYReader(PLYReader *this)

{
  PLYElement *pPVar1;
  pointer pPVar2;
  pointer pcVar3;
  pointer ppPVar4;
  ulong uVar5;
  pointer pPVar6;
  
  ppPVar4 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl
      .super__Vector_impl_data._M_finish != ppPVar4) {
    uVar5 = 0;
    do {
      pPVar1 = ppPVar4[uVar5];
      if (pPVar1 != (PLYElement *)0x0) {
        pPVar2 = (pPVar1->list).
                 super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pPVar6 = (pPVar1->list).
                      super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                      ._M_impl.super__Vector_impl_data._M_start; pPVar6 != pPVar2;
            pPVar6 = pPVar6 + 1) {
          anon_unknown_3::PLYProperty::~PLYProperty(pPVar6);
        }
        pPVar6 = (pPVar1->list).
                 super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pPVar6 != (pointer)0x0) {
          operator_delete(pPVar6);
        }
        pcVar3 = (pPVar1->name)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != &(pPVar1->name).field_2) {
          operator_delete(pcVar3);
        }
        operator_delete(pPVar1);
      }
      uVar5 = uVar5 + 1;
      ppPVar4 = (this->list).
                super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->list).
                                   super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar4 >> 3))
    ;
  }
  if (ppPVar4 != (pointer)0x0) {
    operator_delete(ppPVar4);
  }
  std::ifstream::~ifstream(&this->in);
  pcVar3 = (this->filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->filename).field_2) {
    operator_delete(pcVar3);
    return;
  }
  return;
}

Assistant:

PLYReader::~PLYReader()
{
  for (size_t i=0; i<list.size(); i++)
  {
    delete list[i];
  }
}